

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

void stl(double *x,int N,int f,char *s_window_type,int *s_window,int *s_degree,int *t_window,
        int *t_degree,int *l_window,int *l_degree,int *s_jump,int *t_jump,int *l_jump,int *robust,
        int *inner,int *outer,double *seasonal,double *trend,double *remainder)

{
  int *piVar1;
  int deg;
  int iVar2;
  double *rw;
  double *work;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *__s;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  double *y;
  bool bVar10;
  double dVar11;
  double dVar12;
  uint local_88;
  int local_84;
  int N_local;
  uint local_7c;
  uint local_78;
  int t_window_;
  int l_window_;
  int local_6c;
  int s_jump_;
  int t_jump_;
  int l_jump_;
  int local_5c;
  int outer_;
  double *local_50;
  uint local_48;
  int local_44;
  int f_local;
  int local_34 [2];
  int t_degree_;
  
  local_88 = N;
  local_48 = f;
  if ((1 < f) && (_outer_ = (double *)(ulong)(uint)(f * 2), f * 2 <= N)) {
    local_5c = strcmp(s_window_type,"period");
    if (local_5c == 0) {
      local_84 = N * 10 + 1;
    }
    else {
      if (s_window == (int *)0x0) {
        __s = "Error. Either set s_window_type to period or assign an integer value to s_window ";
        goto LAB_0014649b;
      }
      local_84 = *s_window;
    }
    dVar12 = 0.0;
    _f_local = (double *)(double)local_84;
    if (t_window == (int *)0x0) {
      dVar12 = ceil(((double)f * 1.5) / (1.0 - 1.5 / (double)_f_local));
      local_7c = (int)dVar12 | 1;
      dVar12 = (double)(int)local_7c;
    }
    if (s_degree == (int *)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = *s_degree;
    }
    if (t_degree == (int *)0x0) {
      iVar8 = 1;
    }
    else {
      iVar8 = *t_degree;
    }
    local_34[0] = iVar8;
    local_50 = (double *)CONCAT44(local_50._4_4_,N);
    if (l_window == (int *)0x0) {
      uVar7 = f | 1;
    }
    else {
      uVar7 = *l_window;
    }
    if (l_degree == (int *)0x0) {
      l_degree = local_34;
    }
    deg = *l_degree;
    local_78 = uVar7;
    if (s_jump == (int *)0x0) {
      dVar11 = (double)_f_local / 10.0;
      _f_local = x;
      dVar11 = ceil(dVar11);
    }
    else {
      dVar11 = (double)*s_jump;
      _f_local = x;
    }
    l_window_ = (int)dVar11;
    if (t_jump == (int *)0x0) {
      dVar12 = ceil(dVar12 / 10.0);
    }
    else {
      dVar12 = (double)*t_jump;
    }
    local_6c = (int)dVar12;
    if (l_jump == (int *)0x0) {
      dVar12 = ceil((double)(int)uVar7 / 10.0);
    }
    else {
      dVar12 = (double)*l_jump;
    }
    y = _f_local;
    iVar2 = local_44;
    s_jump_ = (int)dVar12;
    if (robust == (int *)0x0) {
      bVar10 = true;
    }
    else {
      bVar10 = *robust == 0;
    }
    if (inner == (int *)0x0) {
      t_jump_ = bVar10 + 1;
      l_jump_ = 0xf;
      if (bVar10 != false) {
        l_jump_ = 0;
      }
    }
    else {
      t_jump_ = *inner;
      l_jump_ = *outer;
    }
    degCheck(local_44);
    N_local = iVar2;
    degCheck(iVar8);
    local_34[0] = iVar8;
    degCheck(deg);
    iVar8 = (int)local_50;
    sVar9 = (size_t)(int)local_50;
    t_window_ = deg;
    rw = (double *)calloc(sVar9,8);
    work = (double *)calloc((long)(((int)_outer_ + iVar8) * 5),8);
    __ptr = calloc(sVar9,4);
    _outer_ = rw;
    local_50 = work;
    stl_(y,(int *)&local_88,(int *)&local_48,&local_84,(int *)&local_7c,(int *)&local_78,&N_local,
         local_34,&t_window_,&l_window_,&local_6c,&s_jump_,&t_jump_,&l_jump_,rw,seasonal,trend,work)
    ;
    uVar7 = local_48;
    if (local_5c == 0) {
      sVar9 = (size_t)(int)local_48;
      uVar5 = 0;
      uVar6 = (ulong)local_88;
      if ((int)local_88 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        *(int *)((long)__ptr + uVar5 * 4) =
             (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                  (long)(int)local_48);
      }
      __ptr_00 = calloc(sVar9,sVar9 * 8);
      __ptr_01 = calloc(sVar9,sVar9 * 4);
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        lVar4 = (long)*(int *)((long)__ptr + uVar5 * 4);
        piVar1 = (int *)((long)__ptr_01 + lVar4 * 4);
        *piVar1 = *piVar1 + 1;
        *(double *)((long)__ptr_00 + lVar4 * 8) =
             seasonal[uVar5] + *(double *)((long)__ptr_00 + lVar4 * 8);
      }
      uVar3 = 0;
      uVar5 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar5 = uVar3;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(double *)((long)__ptr_00 + uVar3 * 8) =
             *(double *)((long)__ptr_00 + uVar3 * 8) / (double)*(int *)((long)__ptr_01 + uVar3 * 4);
      }
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        seasonal[uVar5] = *(double *)((long)__ptr_00 + (long)*(int *)((long)__ptr + uVar5 * 4) * 8);
      }
      free(__ptr_00);
      free(__ptr_01);
      y = _f_local;
    }
    else {
      uVar6 = 0;
      if (0 < (int)local_88) {
        uVar6 = (ulong)local_88;
      }
    }
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      remainder[uVar5] = (y[uVar5] - seasonal[uVar5]) - trend[uVar5];
    }
    free(_outer_);
    free(local_50);
    free(__ptr);
    return;
  }
  __s = "Series is not periodic or has less than two periods. ";
LAB_0014649b:
  puts(__s);
  exit(-1);
}

Assistant:

void stl(double *x,int N,int f, const char *s_window_type,int *s_window, int *s_degree, int *t_window, int *t_degree,int *l_window,int *l_degree,
    int *s_jump, int *t_jump, int *l_jump, int *robust,int *inner, int *outer,double *seasonal,double *trend, double *remainder) {
    
    double *rw,*work;
    int *seas_cycle;
    int i;
    int s_window_,s_degree_,t_window_,t_degree_,l_window_,l_degree_,s_jump_,t_jump_,l_jump_,inner_,outer_,periodic_,robust_;

    if (f < 2 || N < 2*f) {
        printf("Series is not periodic or has less than two periods. \n");
        exit(-1);
    }

    //Default Values

    periodic_ = 0;

    if (!strcmp(s_window_type,"period")) {
        periodic_ = 1;
        s_window_ = 10 * N + 1;
        s_degree_ = 0;
    } else {
        if (s_window == NULL) {
            printf("Error. Either set s_window_type to period or assign an integer value to s_window \n");
            exit(-1);
        } else {
            s_window_ = *s_window;
        }
    }

    if (t_window == NULL) {
        t_window_ = nextOdd(ceil( 1.5 * f / (1.0 - 1.5 / (double) s_window_)));
    }

    s_degree_ = (s_degree == NULL) ? 0 : *s_degree;

    //if (t_window == NULL) *t_window = 0;
    t_degree_ = (t_degree == NULL) ? 1 : *t_degree;
    l_window_ = (l_window == NULL) ? nextOdd(f) : *l_window;
    l_degree_ = (l_degree == NULL) ? t_degree_ : *l_degree;
    s_jump_ = (s_jump == NULL) ? ceil((double)s_window_ / 10.0) : *s_jump;
    t_jump_ = (t_jump == NULL) ? ceil((double)t_window_ / 10.0) : *t_jump;
    l_jump_ = (l_jump == NULL) ? ceil((double)l_window_ / 10.0) : *l_jump;

    robust_ = (robust == NULL) ? 0 : *robust;
    inner_ = (inner == NULL) ? (robust_ ? 1 : 2) : *inner;
    outer_ = (inner == NULL) ? (robust_ ? 15 : 0) : *outer;

    
    s_degree_ = degCheck(s_degree_);
    t_degree_ = degCheck(t_degree_);
    l_degree_ = degCheck(l_degree_);

    

    // Initialize work vectors

    rw = (double*)calloc(N,sizeof(double));
    work = (double*)calloc((N+2*f)*5,sizeof(double));
    seas_cycle = (int*)calloc(N,sizeof(int));


    stl_(x,&N,&f,&s_window_,&t_window_,&l_window_,&s_degree_,&t_degree_,&l_degree_,&s_jump_,&t_jump_,&l_jump_,&inner_,&outer_,rw,seasonal,trend,work);
	

    if (periodic_) {
        cycle(N,f,seas_cycle);
        applySeasonalMean(seasonal,N,seas_cycle,f);
    }

    for (i = 0; i < N;++i) {
        remainder[i] = x[i] - seasonal[i] - trend[i];
    }

    free(rw);
    free(work);
    free(seas_cycle);
}